

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_basic_types.h
# Opt level: O2

uint __thiscall Potassco::ProgramReader::matchPos(ProgramReader *this,uint max,char *err)

{
  uint uVar1;
  BufferedStream *str;
  
  str = stream(this);
  uVar1 = Potassco::matchPos(str,max,err);
  return uVar1;
}

Assistant:

unsigned matchPos(unsigned max = static_cast<unsigned>(-1), const char* err = "unsigned integer expected") { return Potassco::matchPos(*stream(), max, err); }